

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

bool __thiscall QTipLabel::tipChanged(QTipLabel *this,QPoint *pos,QString *text,QObject *o)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::text((QString *)&local_50,&instance->super_QLabel);
  bVar1 = ::operator!=((QString *)&local_50,text);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  bVar2 = 1;
  if ((!bVar1) && (this->widget == (QWidget *)o)) {
    bVar1 = QRect::isNull(&this->rect);
    if (bVar1) {
      bVar2 = 0;
    }
    else {
      bVar2 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
      bVar2 = bVar2 ^ 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTipLabel::tipChanged(const QPoint &pos, const QString &text, QObject *o)
{
    if (QTipLabel::instance->text() != text)
        return true;

    if (o != widget)
        return true;

    if (!rect.isNull())
        return !rect.contains(pos);
    else
       return false;
}